

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O1

OptionalStorage<llbuild::buildsystem::BuildValue,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::operator=
          (OptionalStorage<llbuild::buildsystem::BuildValue,_false> *this,BuildValue *y)

{
  if (this->hasVal == true) {
    llbuild::buildsystem::BuildValue::operator=((BuildValue *)this,y);
  }
  else {
    llbuild::buildsystem::BuildValue::BuildValue((BuildValue *)this,y);
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasVal)
      *getPointer() = std::move(y);
    else {
      new (storage.buffer) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }